

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

PoolItem * __thiscall soul::PoolAllocator::allocateSpaceForObject(PoolAllocator *this,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  Pool *pPVar3;
  PoolItem *pPVar4;
  ulong uVar5;
  
  uVar5 = size + 0x1f & 0xfffffffffffffff0;
  if (0xffe0 < this->currentPool->nextSlot + uVar5) {
    pPVar3 = (Pool *)operator_new(0xfff0);
    pPVar3->nextSlot = 0;
    this->currentPool = pPVar3;
    std::
    vector<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>,std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>>>
    ::emplace_back<soul::PoolAllocator::Pool*&>
              ((vector<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>,std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,std::default_delete<soul::PoolAllocator::Pool>>>>
                *)this,&this->currentPool);
    if (0xffe0 < this->currentPool->nextSlot + uVar5) {
      throwInternalCompilerError("currentPool->hasSpaceFor (size)","allocateSpaceForObject",0x14b);
    }
  }
  pPVar3 = this->currentPool;
  sVar2 = pPVar3->nextSlot;
  pPVar4 = (PoolItem *)((pPVar3->space)._M_elems + sVar2);
  pPVar4->size = uVar5;
  pcVar1 = (pPVar3->space)._M_elems + sVar2 + 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pPVar3->nextSlot = sVar2 + uVar5;
  return pPVar4;
}

Assistant:

PoolItem& allocateSpaceForObject (size_t size)
    {
        if (! currentPool->hasSpaceFor (size))
        {
            addNewPool();
            SOUL_ASSERT (currentPool->hasSpaceFor (size));
        }

        return currentPool->createItem (size);
    }